

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void DC8uv_C(uint8_t *dst)

{
  uint uVar1;
  byte *pbVar2;
  long lVar3;
  
  pbVar2 = dst + -1;
  uVar1 = 8;
  for (lVar3 = -0x20; lVar3 != -0x18; lVar3 = lVar3 + 1) {
    uVar1 = uVar1 + dst[lVar3] + (uint)*pbVar2;
    pbVar2 = pbVar2 + 0x20;
  }
  Put8x8uv((uint8_t)(uVar1 >> 4),dst);
  return;
}

Assistant:

static void DC8uv_C(uint8_t* dst) {     // DC
  int dc0 = 8;
  int i;
  for (i = 0; i < 8; ++i) {
    dc0 += dst[i - BPS] + dst[-1 + i * BPS];
  }
  Put8x8uv(dc0 >> 4, dst);
}